

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmerge.c
# Opt level: O2

void h2v2_merged_upsample_565D
               (j_decompress_ptr cinfo,JSAMPIMAGE input_buf,JDIMENSION in_row_group_ctr,
               JSAMPARRAY output_buf)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  jpeg_upsampler *pjVar5;
  JSAMPLE *pJVar6;
  _func_void_j_decompress_ptr_JSAMPIMAGE_JDIMENSION_ptr_JDIMENSION_JSAMPARRAY_JDIMENSION_ptr_JDIMENSION
  *p_Var7;
  _func_void_j_decompress_ptr *p_Var8;
  _func_void_j_decompress_ptr_JSAMPIMAGE_JDIMENSION_ptr_JDIMENSION_JSAMPARRAY_JDIMENSION_ptr_JDIMENSION
  *p_Var9;
  JSAMPROW pJVar10;
  JSAMPROW pJVar11;
  JSAMPROW pJVar12;
  JSAMPROW pJVar13;
  JSAMPROW pJVar14;
  JSAMPROW pJVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  uint uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  
  pjVar5 = cinfo->upsample;
  pJVar6 = cinfo->sample_range_limit;
  p_Var7 = pjVar5[1].upsample;
  lVar18 = *(long *)&pjVar5[1].need_context_rows;
  p_Var8 = pjVar5[2].start_pass;
  p_Var9 = pjVar5[2].upsample;
  uVar4 = cinfo->output_width;
  uVar23 = dither_matrix[cinfo->output_scanline & 3];
  uVar20 = dither_matrix[cinfo->output_scanline + 1 & 3];
  pJVar10 = (*input_buf)[in_row_group_ctr * 2];
  pJVar11 = (*input_buf)[(ulong)(in_row_group_ctr * 2) + 1];
  pJVar12 = input_buf[1][in_row_group_ctr];
  pJVar13 = input_buf[2][in_row_group_ctr];
  pJVar14 = *output_buf;
  pJVar15 = output_buf[1];
  for (lVar17 = 0; uVar4 >> 1 != (uint)lVar17; lVar17 = lVar17 + 1) {
    uVar16 = (ulong)pJVar12[lVar17];
    uVar21 = (ulong)pJVar13[lVar17];
    lVar27 = (long)*(int *)(p_Var7 + uVar21 * 4);
    lVar25 = (long)*(int *)(lVar18 + uVar16 * 4);
    uVar22 = (ulong)pJVar10[lVar17 * 2];
    uVar24 = uVar23 & 0xff;
    lVar26 = (long)(int)((ulong)(*(long *)(p_Var8 + uVar21 * 8) + *(long *)(p_Var9 + uVar16 * 8)) >>
                        0x10);
    uVar19 = (uint)(uVar23 >> 8);
    uVar16 = (ulong)pJVar10[lVar17 * 2 + 1];
    uVar21 = uVar23 >> 8 & 0xff;
    uVar23 = (ulong)(uVar19 << 0x18 | (uVar19 & 0xffff00 | (int)uVar23 << 0x18) >> 8);
    bVar1 = pJVar6[uVar16 + lVar26 + (uVar21 >> 1)];
    bVar2 = pJVar6[lVar27 + uVar16 + uVar21];
    bVar3 = pJVar6[uVar16 + lVar25 + uVar21];
    *(ushort *)(pJVar14 + lVar17 * 4) =
         (ushort)(pJVar6[uVar22 + lVar25 + uVar24] >> 3) |
         (pJVar6[lVar27 + uVar22 + uVar24] & 0xfff8) * 0x100 +
         (pJVar6[uVar22 + lVar26 + (uVar24 >> 1)] & 0xfc) * 8;
    *(ushort *)(pJVar14 + lVar17 * 4 + 2) =
         (ushort)(bVar3 >> 3) | (bVar2 & 0xfff8) * 0x100 + (bVar1 & 0xfc) * 8;
    uVar16 = (ulong)pJVar11[lVar17 * 2];
    uVar22 = uVar20 & 0xff;
    uVar19 = (uint)(uVar20 >> 8);
    uVar21 = (ulong)pJVar11[lVar17 * 2 + 1];
    uVar24 = uVar20 >> 8 & 0xff;
    bVar1 = pJVar6[lVar26 + uVar21 + (uVar24 >> 1)];
    bVar2 = pJVar6[lVar27 + uVar21 + uVar24];
    bVar3 = pJVar6[lVar25 + uVar21 + uVar24];
    uVar20 = (ulong)(uVar19 << 0x18 | (uVar19 & 0xffff00 | (int)uVar20 << 0x18) >> 8);
    *(ushort *)(pJVar15 + lVar17 * 4) =
         (ushort)(pJVar6[uVar16 + lVar25 + uVar22] >> 3) |
         (pJVar6[lVar27 + uVar16 + uVar22] & 0xfff8) * 0x100 +
         (pJVar6[uVar16 + lVar26 + (uVar22 >> 1)] & 0xfc) * 8;
    *(ushort *)(pJVar15 + lVar17 * 4 + 2) =
         (ushort)(bVar3 >> 3) | (bVar2 & 0xfff8) * 0x100 + (bVar1 & 0xfc) * 8;
  }
  if ((uVar4 & 1) != 0) {
    uVar16 = (ulong)pJVar12[lVar17];
    uVar24 = (ulong)pJVar13[lVar17];
    lVar26 = (long)*(int *)(p_Var7 + uVar24 * 4);
    lVar25 = (long)*(int *)(lVar18 + uVar16 * 4);
    uVar21 = (ulong)pJVar10[lVar17 * 2];
    uVar23 = uVar23 & 0xff;
    lVar18 = (long)(int)((ulong)(*(long *)(p_Var8 + uVar24 * 8) + *(long *)(p_Var9 + uVar16 * 8)) >>
                        0x10);
    *(ushort *)(pJVar14 + lVar17 * 4) =
         (ushort)(pJVar6[uVar21 + lVar25 + uVar23] >> 3) |
         (pJVar6[lVar26 + uVar21 + uVar23] & 0xfff8) * 0x100 +
         (pJVar6[uVar21 + lVar18 + (uVar23 >> 1)] & 0xfc) * 8;
    uVar23 = (ulong)pJVar11[lVar17 * 2];
    uVar20 = uVar20 & 0xff;
    *(ushort *)(pJVar15 + lVar17 * 4) =
         (ushort)(pJVar6[lVar25 + uVar23 + uVar20] >> 3) |
         (pJVar6[lVar26 + uVar23 + uVar20] & 0xfff8) * 0x100 +
         (pJVar6[lVar18 + uVar23 + (uVar20 >> 1)] & 0xfc) * 8;
  }
  return;
}

Assistant:

METHODDEF(void)
h2v2_merged_upsample_565D(j_decompress_ptr cinfo, JSAMPIMAGE input_buf,
                          JDIMENSION in_row_group_ctr, JSAMPARRAY output_buf)
{
  if (is_big_endian())
    h2v2_merged_upsample_565D_be(cinfo, input_buf, in_row_group_ctr,
                                 output_buf);
  else
    h2v2_merged_upsample_565D_le(cinfo, input_buf, in_row_group_ctr,
                                 output_buf);
}